

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O3

void __thiscall rsg::Function::tokenize(Function *this,GeneratorState *state,TokenStream *str)

{
  pointer pTVar1;
  size_t sVar2;
  size_t sVar3;
  pointer ppVVar4;
  Token local_48;
  Token local_38;
  
  VariableType::tokenizeShortType(&this->m_returnType,str);
  Token::Token(&local_48,(this->m_name)._M_dataplus._M_p);
  pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar1 >> 4;
  sVar3 = str->m_numTokens;
  if (sVar2 == sVar3) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x40);
    pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = str->m_numTokens;
  }
  Token::operator=(pTVar1 + sVar3,&local_48);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_48);
  local_48.m_type = LEFT_PAREN;
  pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar1 >> 4;
  sVar3 = str->m_numTokens;
  if (sVar2 == sVar3) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x40);
    pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = str->m_numTokens;
  }
  Token::operator=(pTVar1 + sVar3,&local_48);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_48);
  ppVVar4 = (this->m_parameters).
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar4 !=
      (this->m_parameters).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (ppVVar4 !=
          (this->m_parameters).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_48.m_type = COMMA;
        pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar2 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4;
        sVar3 = str->m_numTokens;
        if (sVar2 == sVar3) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x40);
          pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          sVar3 = str->m_numTokens;
        }
        Token::operator=(pTVar1 + sVar3,&local_48);
        str->m_numTokens = str->m_numTokens + 1;
        Token::~Token(&local_48);
      }
      Variable::tokenizeDeclaration(*ppVVar4,state,str);
      ppVVar4 = ppVVar4 + 1;
    } while (ppVVar4 !=
             (this->m_parameters).
             super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_48.m_type = RIGHT_PAREN;
  pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar1 >> 4;
  sVar3 = str->m_numTokens;
  if (sVar2 == sVar3) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x40);
    pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = str->m_numTokens;
  }
  Token::operator=(pTVar1 + sVar3,&local_48);
  sVar2 = str->m_numTokens;
  sVar3 = sVar2 + 1;
  str->m_numTokens = sVar3;
  local_38.m_type = NEWLINE;
  pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar1 >> 4 == sVar3) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x41);
    pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = str->m_numTokens;
  }
  Token::operator=(pTVar1 + sVar3,&local_38);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_38);
  Token::~Token(&local_48);
  BlockStatement::tokenize(&this->m_functionBlock,state,str);
  return;
}

Assistant:

void Function::tokenize (GeneratorState& state, TokenStream& str) const
{
	// Return type
	m_returnType.tokenizeShortType(str);

	// Function name
	DE_ASSERT(m_name != "");
	str << Token(m_name.c_str());

	// Parameters
	str << Token::LEFT_PAREN;

	for (vector<Variable*>::const_iterator i = m_parameters.begin(); i != m_parameters.end(); i++)
	{
		if (i != m_parameters.begin())
			str << Token::COMMA;
		(*i)->tokenizeDeclaration(state, str);
	}

	str << Token::RIGHT_PAREN << Token::NEWLINE;

	// Tokenize body
	m_functionBlock.tokenize(state, str);
}